

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall
VariationalBayesEstimatorOnLDA::writeParameter
          (VariationalBayesEstimatorOnLDA *this,string *thetaFilename,string *phiFilename,
          string *alphaFilename,string *betaFilename)

{
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)thetaFilename);
  outputVector<double>(&this->_thetaEx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)phiFilename);
  outputVector<double>(&this->_phiEx,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,(string *)alphaFilename);
  outputVector<double>(&this->_alphaTimeSeries,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)betaFilename);
  outputVector<double>(&this->_betaTimeSeries,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeParameter(string thetaFilename, string phiFilename, string alphaFilename, string betaFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
    outputVector(_alphaTimeSeries, alphaFilename);
    outputVector(_betaTimeSeries, betaFilename);
}